

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.h
# Opt level: O2

uint * lzham::lzham_new_array<unsigned_int>(uint32 num)

{
  void *pvVar1;
  uint uVar2;
  uint *puVar3;
  
  uVar2 = num + (num == 0);
  puVar3 = (uint *)0x0;
  pvVar1 = lzham_malloc((ulong)uVar2 * 4 + 0x10,(size_t *)0x0);
  if (pvVar1 != (void *)0x0) {
    puVar3 = (uint *)((long)pvVar1 + 0x10);
    *(uint *)((long)pvVar1 + 0xc) = uVar2;
    *(uint *)((long)pvVar1 + 8) = ~uVar2;
  }
  return puVar3;
}

Assistant:

inline T* lzham_new_array(uint32 num)
   {
      if (!num) num = 1;

      uint8* q = static_cast<uint8*>(lzham_malloc(LZHAM_MIN_ALLOC_ALIGNMENT + sizeof(T) * num));
      if (!q)
         return NULL;

      T* p = reinterpret_cast<T*>(q + LZHAM_MIN_ALLOC_ALIGNMENT);

      reinterpret_cast<uint32*>(p)[-1] = num;
      reinterpret_cast<uint32*>(p)[-2] = ~num;

      if (!LZHAM_IS_SCALAR_TYPE(T))
      {
         helpers::construct_array(p, num);
      }
      return p;
   }